

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

HRESULT __thiscall
Js::ScriptContext::CompileUTF8Core
          (ScriptContext *this,Parser *ps,Utf8SourceInfo *utf8SourceInfo,SRCINFO *srcInfo,
          BOOL fOriginalUTF8Code,LPCUTF8 pszSrc,size_t cbLength,ULONG grfscr,
          CompileScriptException *pse,charcount_t *cchLength,size_t *srcLength,uint *sourceIndex,
          ParseableFunctionInfo **func,SimpleDataCacheWrapper *pDataCache)

{
  SourceContextInfo *sourceContextInfo;
  code *pcVar1;
  ParseNodeProg *this_00;
  bool bVar2;
  HRESULT HVar3;
  uint sourceIndex_00;
  undefined4 *puVar4;
  charcount_t cVar5;
  char *cbLength_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int cchLength_00;
  uint sourceCRC;
  LPCUTF8 extraout_RDX;
  LPCUTF8 extraout_RDX_00;
  LPCUTF8 pszSrc_00;
  ULONG sourceCRC_00;
  size_t sVar6;
  char *this_01;
  ScriptContext *this_02;
  undefined4 in_register_00000084;
  SRCINFO *pSVar7;
  Utf8SourceInfo *utf8SourceInfo_00;
  ParseableFunctionInfo *func_00;
  uint *in_stack_ffffffffffffff68;
  DWORD parserStateCacheByteCount_00;
  NativeModule *in_stack_ffffffffffffff78;
  byte *local_50;
  byte *parserStateCacheBuffer;
  ParseNodeProg *parseTree;
  DWORD local_38;
  undefined4 local_34;
  DWORD parserStateCacheByteCount;
  
  pSVar7 = (SRCINFO *)CONCAT44(in_register_00000084,fOriginalUTF8Code);
  *func = (ParseableFunctionInfo *)0x0;
  *srcLength = (ulong)*cchLength;
  parserStateCacheBuffer = (byte *)0x0;
  sourceContextInfo = (srcInfo->sourceContextInfo).ptr;
  parseTree = (ParseNodeProg *)utf8SourceInfo;
  if ((((grfscr >> 8 & 1) == 0) || (pDataCache == (SimpleDataCacheWrapper *)0x0)) ||
     (DAT_01433309 == '\0')) {
    local_50 = (byte *)0x0;
    local_38 = 0;
    local_34 = 0;
  }
  else {
    utf8SourceInfo_00 = (Utf8SourceInfo *)pszSrc;
    bVar2 = IsScriptContextInDebugMode(this);
    cVar5 = (charcount_t)srcInfo;
    local_50 = (byte *)0x0;
    local_38 = 0;
    if (bVar2) {
      local_34 = 0;
      pSVar7 = (SRCINFO *)(ulong)(uint)fOriginalUTF8Code;
    }
    else {
      this_02 = (ScriptContext *)0x0;
      sVar6 = cbLength;
      CalculateCRC(0,cbLength,pszSrc);
      HVar3 = TryDeserializeParserState
                        (this_02,(ULONG)sVar6,sourceCRC,cVar5,pSVar7,utf8SourceInfo_00,
                         in_stack_ffffffffffffff68,false,in_stack_ffffffffffffff78,func,&local_50,
                         &local_38,pDataCache);
      local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)HVar3 >> 8),1);
      pSVar7 = (SRCINFO *)(ulong)(uint)fOriginalUTF8Code;
    }
  }
  if ((int)pSVar7 == 0) {
    HVar3 = Parser::ParseCesu8Source
                      (ps,(ParseNodeProg **)&parserStateCacheBuffer,pszSrc,cbLength,grfscr,pse,
                       &sourceContextInfo->nextLocalFunctionId,sourceContextInfo);
    cchLength_00 = extraout_EDX_00;
  }
  else {
    HVar3 = Parser::ParseUtf8Source
                      (ps,(ParseNodeProg **)&parserStateCacheBuffer,pszSrc,cbLength,grfscr,pse,
                       &sourceContextInfo->nextLocalFunctionId,sourceContextInfo);
    cVar5 = ps->m_sourceLim;
    *cchLength = cVar5;
    (parseTree->super_ParseNodeFnc).super_ParseNode.ichLim = cVar5;
    cchLength_00 = extraout_EDX;
  }
  (parseTree->super_ParseNodeFnc).functionId = grfscr;
  *srcLength = ps->m_length;
  if (-1 < HVar3) {
    sourceIndex_00 =
         SaveSourceNoCopy(this,(Utf8SourceInfo *)parseTree,cchLength_00,(int)pSVar7 == 0);
    this_01 = (char *)parserStateCacheBuffer;
    *sourceIndex = sourceIndex_00;
    bVar2 = IsForceNoNative(this);
    pSVar7 = (SRCINFO *)(ulong)sourceIndex_00;
    cbLength_00 = (char *)func;
    sourceCRC_00 = grfscr;
    HVar3 = GenerateByteCode((ParseNodeProg *)this_01,grfscr,this,func,sourceIndex_00,bVar2,ps,pse,
                             (ScopeInfo *)0x0,(ScriptFunction **)0x0);
    parserStateCacheByteCount_00 = (DWORD)pse;
    (parseTree->super_ParseNodeFnc).deferredParseNextFunctionId = grfscr;
    if (-1 < HVar3) {
      if ((char)local_34 == '\0') {
        return HVar3;
      }
      func_00 = *func;
      pszSrc_00 = extraout_RDX;
      if (func_00 == (ParseableFunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        this_01 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
        ;
        cbLength_00 = "*func != nullptr";
        sourceCRC_00 = 0x9b1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x9b1,"(*func != nullptr)","*func != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        func_00 = *func;
        pszSrc_00 = extraout_RDX_00;
      }
      TrySerializeParserState
                ((ScriptContext *)this_01,sourceCRC_00,pszSrc_00,(size_t)cbLength_00,pSVar7,func_00,
                 (byte *)ps,parserStateCacheByteCount_00,pDataCache);
      return HVar3;
    }
  }
  this_00 = parseTree;
  bVar2 = IsScriptContextInDebugMode(this);
  if (((bVar2) && (((this_00->super_ParseNodeFnc).lineNumber & 4) == 0)) &&
     (bVar2 = Utf8SourceInfo::IsInDebugMode((Utf8SourceInfo *)this_00), !bVar2)) {
    Utf8SourceInfo::SetInDebugMode((Utf8SourceInfo *)this_00,true);
  }
  return HVar3;
}

Assistant:

HRESULT ScriptContext::CompileUTF8Core(
        __in Parser& ps,
        __in Js::Utf8SourceInfo* utf8SourceInfo,
        __in SRCINFO *srcInfo,
        __in BOOL fOriginalUTF8Code,
        _In_reads_bytes_(cbLength) LPCUTF8 pszSrc,
        __in size_t cbLength,
        __in ULONG grfscr,
        __in CompileScriptException *pse,
        __inout charcount_t& cchLength,
        __out size_t& srcLength,
        __out uint& sourceIndex,
        __deref_out Js::ParseableFunctionInfo ** func,
        __in_opt Js::SimpleDataCacheWrapper* pDataCache
    )
    {
        HRESULT hr = E_FAIL;
        (*func) = nullptr;
        srcLength = cchLength;

        bool isCesu8 = !fOriginalUTF8Code;
        ParseNodeProg * parseTree = nullptr;
        SourceContextInfo * sourceContextInfo = srcInfo->sourceContextInfo;
        bool fUseParserStateCache = ((grfscr & fscrCreateParserState) == fscrCreateParserState)
            && CONFIG_FLAG(ParserStateCache)
            && pDataCache != nullptr
            && !this->IsScriptContextInDebugMode();
        byte* parserStateCacheBuffer = nullptr;
        DWORD parserStateCacheByteCount = 0;
        uint computedSourceCRC = 0;

        if (fUseParserStateCache)
        {
            computedSourceCRC = CalculateCRC(0, cbLength, (void*)pszSrc);
            hr = TryDeserializeParserState(grfscr, computedSourceCRC, cchLength, srcInfo, utf8SourceInfo, sourceIndex, isCesu8, nullptr, func, &parserStateCacheBuffer, &parserStateCacheByteCount, pDataCache);
#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
            // ERROR_WRITE_PROTECT indicates we cannot cache this script for whatever reason.
            // Disable generating and serializing the parser state cache.
            if (hr == HRESULT_FROM_WIN32(ERROR_WRITE_PROTECT))
            {
                fUseParserStateCache = false;
                grfscr &= ~fscrCreateParserState;
            }
#endif
        }

        // If hydrating the parser state cache failed, let's try to do an ordinary parse
        if (FAILED(hr) || *func == nullptr)
        {
            if (fOriginalUTF8Code)
            {
                hr = ps.ParseUtf8Source(&parseTree, pszSrc, cbLength, grfscr, pse, &sourceContextInfo->nextLocalFunctionId,
                    sourceContextInfo);
                cchLength = ps.GetSourceIchLim();

                // Correcting total number of characters.
                utf8SourceInfo->SetCchLength(cchLength);
            }
            else
            {
                hr = ps.ParseCesu8Source(&parseTree, pszSrc, cbLength, grfscr, pse, &sourceContextInfo->nextLocalFunctionId,
                    sourceContextInfo);
            }

            utf8SourceInfo->SetParseFlags(grfscr);
            srcLength = ps.GetSourceLength();

            if (SUCCEEDED(hr))
            {
                sourceIndex = this->SaveSourceNoCopy(utf8SourceInfo, cchLength, isCesu8);
                hr = GenerateByteCode(parseTree, grfscr, this, func, sourceIndex, this->IsForceNoNative(), &ps, pse);
                utf8SourceInfo->SetByteCodeGenerationFlags(grfscr);
            }
        }

        if (SUCCEEDED(hr))
        {
            // If we are supposed to create a parser state cache, do that now since we have the generated code and the parser available.
            // Note: We do need to serialze the parser state cache again even if we just deserialized it because the data cache will
            // persist whatever we write into it and it starts empty.
            if (fUseParserStateCache)
            {
                Assert(*func != nullptr);
                TrySerializeParserState(computedSourceCRC, pszSrc, cbLength, srcInfo, *func, parserStateCacheBuffer, parserStateCacheByteCount, pDataCache);
            }
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        else if (this->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
        {
            // In case of syntax error, if we are in debug mode, put the utf8SourceInfo into debug mode.
            utf8SourceInfo->SetInDebugMode(true);
        }
#endif

        return hr;
    }